

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid.cpp
# Opt level: O2

int __thiscall
ncnn::HardSigmoid::forward_inplace(HardSigmoid *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  int i;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int _c;
  float fVar7;
  Mat local_78;
  
  uVar5 = bottom_top_blob->h * bottom_top_blob->w;
  uVar3 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar3;
  }
  iVar4 = bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    iVar4 = 0;
  }
  while (_c = (int)uVar3, _c != iVar4) {
    Mat::channel(&local_78,bottom_top_blob,_c);
    pvVar2 = local_78.data;
    Mat::~Mat(&local_78);
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      fVar1 = *(float *)((long)pvVar2 + uVar3 * 4);
      fVar7 = 0.0;
      if ((this->lower <= fVar1) && (fVar7 = 1.0, fVar1 < this->upper || fVar1 == this->upper)) {
        fVar7 = fVar1 * this->alpha + this->beta;
      }
      *(float *)((long)pvVar2 + uVar3 * 4) = fVar7;
    }
    uVar3 = (ulong)(_c + 1);
  }
  return 0;
}

Assistant:

int HardSigmoid::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < lower)
                ptr[i] = 0.f;
            else if (ptr[i] > upper)
                ptr[i] = 1.f;
            else
                ptr[i] = ptr[i] * alpha + beta;
        }
    }

    return 0;
}